

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::CloseCompileCommandsStream(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  type pcVar2;
  cmGlobalNinjaGenerator *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CompileCommandsStream);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CompileCommandsStream);
    std::operator<<((ostream *)pcVar2,"\n]");
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
              (&this->CompileCommandsStream,(pointer)0x0);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CloseCompileCommandsStream()
{
  if (this->CompileCommandsStream) {
    *this->CompileCommandsStream << "\n]";
    this->CompileCommandsStream.reset();
  }
}